

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceIntersection.cpp
# Opt level: O2

int GeoCalcs::DistanceIntersection
              (LLPoint *pt1,double dist13,LLPoint *pt2,double dist23,LLPoint *intPtC1,
              LLPoint *intPtC2,double dTol)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  LLPoint LVar8;
  InverseResult result;
  
  result.azimuth = 0.0;
  result.reverseAzimuth = 0.0;
  result.distance = 0.0;
  DistVincenty(pt1,pt2,&result);
  dVar4 = result.distance;
  dVar6 = result.azimuth;
  dVar7 = (dist13 + dist23) - result.distance;
  iVar5 = 0;
  if ((0.0 <= dVar7 + dTol) && (ABS(dist13 - dist23) <= result.distance)) {
    if (ABS(dVar7) <= dTol) {
      iVar5 = 1;
      intPtC2 = intPtC1;
    }
    else {
      dVar7 = cos(dist23 / kSphereRadius);
      dVar1 = cos(dist13 / kSphereRadius);
      dVar2 = cos(dVar4 / kSphereRadius);
      dVar3 = sin(dist13 / kSphereRadius);
      dVar4 = sin(dVar4 / kSphereRadius);
      dVar4 = acos((dVar7 - dVar2 * dVar1) / (dVar4 * dVar3));
      LVar8 = DestVincenty(pt1,dVar6 - dVar4,dist13);
      intPtC1->latitude = LVar8.latitude;
      intPtC1->longitude = LVar8.longitude;
      iVar5 = 2;
      dVar6 = dVar6 + dVar4;
    }
    LVar8 = DestVincenty(pt1,dVar6,dist13);
    intPtC2->latitude = LVar8.latitude;
    intPtC2->longitude = LVar8.longitude;
  }
  return iVar5;
}

Assistant:

int DistanceIntersection(const LLPoint &pt1, double dist13, const LLPoint &pt2, double dist23,
                             LLPoint &intPtC1, LLPoint &intPtC2, double dTol)
    {
        InverseResult result;
        DistVincenty(pt1, pt2, result);
        const double dist12 = result.distance;
        const double crs12 = result.azimuth;

        if ((dist13 + dist23 - dist12 + dTol < 0) ||
            fabs(dist13 - dist23) > dist12)
            return 0;
        if (fabs(dist13 + dist23 - dist12) <= dTol)
        {
            intPtC1 = DestVincenty(pt1, crs12, dist13);
            return 1;
        }

        const double cosA_R = cos(dist23 / kSphereRadius);
        const double cosB_R = cos(dist13 / kSphereRadius);
        const double cosC_R = cos(dist12 / kSphereRadius);
        const double sinB_R = sin(dist13 / kSphereRadius);
        const double sinC_R = sin(dist12 / kSphereRadius);
        const double A = acos((cosA_R - cosB_R * cosC_R) / (sinB_R * sinC_R));

        intPtC1 = DestVincenty(pt1, crs12 - A, dist13);
        intPtC2 = DestVincenty(pt1, crs12 + A, dist13);

        return 2;
    }